

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O1

unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> cmCryptoHash::New(string_view algo)

{
  int iVar1;
  cmCryptoHash *this;
  void *in_RDX;
  char *__n;
  tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_> __args;
  size_type __rlen;
  
  __n = algo._M_str;
  __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
  super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)algo._M_len;
  switch(__n) {
  case (char *)0x3:
    iVar1 = bcmp(in_RDX,"MD5",(size_t)__n);
    if (iVar1 == 0) {
      this = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(this,AlgoMD5);
      goto LAB_0011db5b;
    }
    if (__n != (char *)0x8) {
      if (__n != (char *)0x6) {
        if (__n != (char *)0x4) goto switchD_0011d94e_caseD_5;
        goto switchD_0011d94e_caseD_4;
      }
      goto switchD_0011d94e_caseD_6;
    }
    break;
  case (char *)0x4:
switchD_0011d94e_caseD_4:
    iVar1 = bcmp(in_RDX,"SHA1",(size_t)__n);
    if (iVar1 == 0) {
      this = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(this,AlgoSHA1);
      goto LAB_0011db5b;
    }
    if (__n != (char *)0x8) {
      if (__n != (char *)0x6) goto switchD_0011d94e_caseD_5;
      goto switchD_0011d94e_caseD_6;
    }
    break;
  default:
    goto switchD_0011d94e_caseD_5;
  case (char *)0x6:
switchD_0011d94e_caseD_6:
    iVar1 = bcmp(in_RDX,"SHA224",(size_t)__n);
    if (iVar1 == 0) {
      this = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(this,AlgoSHA224);
      goto LAB_0011db5b;
    }
    if (__n != (char *)0x8) {
      if (__n == (char *)0x6) {
        iVar1 = bcmp(in_RDX,"SHA256",6);
        if (iVar1 == 0) {
          this = (cmCryptoHash *)operator_new(0x10);
          cmCryptoHash(this,AlgoSHA256);
LAB_0011db5b:
          *(cmCryptoHash **)
           __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
           super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl = this;
          return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
                 (tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)
                 __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                 super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
        }
        iVar1 = bcmp(in_RDX,"SHA384",6);
        if (iVar1 == 0) {
          this = (cmCryptoHash *)operator_new(0x10);
          cmCryptoHash(this,AlgoSHA384);
          goto LAB_0011db5b;
        }
        iVar1 = bcmp(in_RDX,"SHA512",6);
        if (iVar1 != 0) goto switchD_0011d94e_caseD_5;
        goto LAB_0011db6b;
      }
      goto switchD_0011d94e_caseD_5;
    }
    break;
  case (char *)0x8:
    break;
  }
  iVar1 = bcmp(in_RDX,"SHA3_224",(size_t)__n);
  if ((iVar1 == 0) ||
     ((__n == (char *)0x8 &&
      (((iVar1 = bcmp(in_RDX,"SHA3_256",8), iVar1 == 0 ||
        (iVar1 = bcmp(in_RDX,"SHA3_384",8), iVar1 == 0)) ||
       (iVar1 = bcmp(in_RDX,"SHA3_512",8), iVar1 == 0)))))) {
LAB_0011db6b:
    std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
              ((Algo *)__args.
                       super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                       super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
    return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
           (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
           __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
           super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
  }
switchD_0011d94e_caseD_5:
  *(undefined8 *)
   __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
   super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl = 0;
  return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
         (tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)
         __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
         super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmCryptoHash> cmCryptoHash::New(cm::string_view algo)
{
  if (algo == "MD5") {
    return cm::make_unique<cmCryptoHash>(AlgoMD5);
  }
  if (algo == "SHA1") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA1);
  }
  if (algo == "SHA224") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA224);
  }
  if (algo == "SHA256") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA256);
  }
  if (algo == "SHA384") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA384);
  }
  if (algo == "SHA512") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA512);
  }
  if (algo == "SHA3_224") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_224);
  }
  if (algo == "SHA3_256") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_256);
  }
  if (algo == "SHA3_384") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_384);
  }
  if (algo == "SHA3_512") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_512);
  }
  return std::unique_ptr<cmCryptoHash>(nullptr);
}